

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableWidget::setHorizontalHeaderItem(QTableWidget *this,int column,QTableWidgetItem *item)

{
  QTableModel *this_00;
  QTableWidgetItem *pQVar1;
  
  if (item != (QTableWidgetItem *)0x0) {
    item->view = this;
    this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::setHorizontalHeaderItem(this_00,column,item);
    return;
  }
  pQVar1 = takeHorizontalHeaderItem(this,column);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
    return;
  }
  return;
}

Assistant:

void QTableWidget::setHorizontalHeaderItem(int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        item->view = this;
        d->tableModel()->setHorizontalHeaderItem(column, item);
    } else {
        delete takeHorizontalHeaderItem(column);
    }
}